

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O3

void __thiscall icu_63::TZDBNames::~TZDBNames(TZDBNames *this)

{
  char **buffer;
  long lVar1;
  
  this->_vptr_TZDBNames = (_func_int **)&PTR__TZDBNames_003a42f0;
  if (this->fNames != (UChar **)0x0) {
    uprv_free_63(this->fNames);
  }
  buffer = this->fRegions;
  if (buffer != (char **)0x0) {
    if (0 < this->fNumRegions) {
      lVar1 = 0;
      do {
        uprv_free_63(buffer[lVar1]);
        lVar1 = lVar1 + 1;
      } while ((int)lVar1 < this->fNumRegions);
      buffer = this->fRegions;
    }
    uprv_free_63(buffer);
  }
  return;
}

Assistant:

TZDBNames::~TZDBNames() {
    if (fNames != NULL) {
        uprv_free(fNames);
    }
    if (fRegions != NULL) {
        char **p = fRegions;
        for (int32_t i = 0; i < fNumRegions; p++, i++) {
            uprv_free(*p);
        }
        uprv_free(fRegions);
    }
}